

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O1

StringRef __thiscall llvm::ARM::getCanonicalArchName(ARM *this,StringRef Arch)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  StringRef Str;
  StringRef Str_00;
  StringRef SVar7;
  StringRef local_20;
  
  pcVar6 = Arch.Data;
  local_20.Data = (char *)this;
  local_20.Length = (size_t)pcVar6;
  if ((pcVar6 < (char *)0x5) || (this[4] != (ARM)0x34 || *(int *)this != 0x366d7261)) {
    if (((char *)0x2 < pcVar6) && (this[2] == (ARM)0x6d && *(short *)this == 0x7261)) {
      pcVar2 = (char *)0x3;
      goto LAB_001ce7d1;
    }
    if (((char *)0x4 < pcVar6) && (this[4] == (ARM)0x62 && *(int *)this == 0x6d756874))
    goto LAB_001ce7c5;
    pcVar2 = (char *)0xffffffffffffffff;
    bVar1 = true;
    if ((pcVar6 < (char *)0x7) || (*(int *)(this + 3) != 0x34366863 || *(int *)this != 0x63726161))
    goto LAB_001ce7d3;
    Str.Length = 2;
    Str.Data = "eb";
    sVar3 = StringRef::find(&local_20,Str,0);
    if (sVar3 == 0xffffffffffffffff) {
      pcVar2 = (char *)0x7;
      pcVar5 = (char *)0x7;
      if (local_20.Length < (char *)0x7) {
        pcVar5 = (char *)local_20.Length;
      }
      if (2 < local_20.Length - (long)pcVar5) {
        pcVar2 = (char *)((ulong)(((ARM *)(local_20.Data + 2))[(long)pcVar5] == (ARM)0x65 &&
                                 *(short *)(local_20.Data + (long)pcVar5) == 0x625f) * 3 + 7);
      }
      goto LAB_001ce7d1;
    }
  }
  else {
LAB_001ce7c5:
    pcVar2 = (char *)0x5;
LAB_001ce7d1:
    bVar1 = false;
LAB_001ce7d3:
    pcVar5 = (char *)local_20.Length;
    if (bVar1) {
LAB_001ce7fc:
      if (((char *)0x1 < local_20.Length) &&
         ((*(short *)((ARM *)(local_20.Data + -2) + local_20.Length) == 0x6265 &&
          (pcVar5 = (char *)(local_20.Length + -2), local_20.Length < (char *)(local_20.Length + -2)
          )))) {
        pcVar5 = (char *)local_20.Length;
      }
    }
    else {
      pcVar4 = pcVar2;
      if (local_20.Length < pcVar2) {
        pcVar4 = (char *)local_20.Length;
      }
      if ((local_20.Length - (long)pcVar4 < 2) ||
         (*(short *)(local_20.Data + (long)pcVar4) != 0x6265)) goto LAB_001ce7fc;
      pcVar2 = pcVar2 + 2;
    }
    local_20.Length = (size_t)pcVar5;
    if (pcVar2 != (char *)0xffffffffffffffff) {
      pcVar5 = pcVar2;
      if (local_20.Length < pcVar2) {
        pcVar5 = (char *)local_20.Length;
      }
      local_20.Length = local_20.Length + -(long)pcVar5;
      local_20.Data = local_20.Data + (long)pcVar5;
    }
    if (((char *)local_20.Length == (char *)0x0) ||
       (pcVar6 = (char *)local_20.Length, this = (ARM *)local_20.Data,
       pcVar2 == (char *)0xffffffffffffffff)) goto LAB_001ce8b7;
    if (((char *)local_20.Length == (char *)0x1) ||
       (((ARM)*local_20.Data == (ARM)0x76 && ((int)(char)*(ARM *)(local_20.Data + 1) - 0x30U < 10)))
       ) {
      Str_00.Length = 2;
      Str_00.Data = "eb";
      sVar3 = StringRef::find(&local_20,Str_00,0);
      pcVar6 = (char *)local_20.Length;
      this = (ARM *)local_20.Data;
      if (sVar3 != 0xffffffffffffffff) {
        this = (ARM *)0x209faf;
        pcVar6 = (char *)0x0;
      }
      goto LAB_001ce8b7;
    }
  }
  this = (ARM *)0x209faf;
  pcVar6 = (char *)0x0;
LAB_001ce8b7:
  SVar7.Length = (size_t)pcVar6;
  SVar7.Data = (char *)this;
  return SVar7;
}

Assistant:

StringRef llvm::ARM::getCanonicalArchName(StringRef Arch) {
  size_t offset = StringRef::npos;
  StringRef A = Arch;
  StringRef Error = "";

  // Begins with "arm" / "thumb", move past it.
  if (A.startswith("arm64"))
    offset = 5;
  else if (A.startswith("arm"))
    offset = 3;
  else if (A.startswith("thumb"))
    offset = 5;
  else if (A.startswith("aarch64")) {
    offset = 7;
    // AArch64 uses "_be", not "eb" suffix.
    if (A.find("eb") != StringRef::npos)
      return Error;
    if (A.substr(offset, 3) == "_be")
      offset += 3;
  }

  // Ex. "armebv7", move past the "eb".
  if (offset != StringRef::npos && A.substr(offset, 2) == "eb")
    offset += 2;
  // Or, if it ends with eb ("armv7eb"), chop it off.
  else if (A.endswith("eb"))
    A = A.substr(0, A.size() - 2);
  // Trim the head
  if (offset != StringRef::npos)
    A = A.substr(offset);

  // Empty string means offset reached the end, which means it's valid.
  if (A.empty())
    return Arch;

  // Only match non-marketing names
  if (offset != StringRef::npos) {
    // Must start with 'vN'.
    if (A.size() >= 2 && (A[0] != 'v' || !std::isdigit(A[1])))
      return Error;
    // Can't have an extra 'eb'.
    if (A.find("eb") != StringRef::npos)
      return Error;
  }

  // Arch will either be a 'v' name (v7a) or a marketing name (xscale).
  return A;
}